

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Pack.h
# Opt level: O1

axl_va_list * __thiscall
axl::sl::PackPtrSize::operator()
          (axl_va_list *__return_storage_ptr__,PackPtrSize *this,void *p,size_t *size,
          axl_va_list *va)

{
  uint uVar1;
  void *src;
  size_t __n;
  undefined8 uVar2;
  undefined8 *puVar3;
  size_t *psVar4;
  
  uVar1 = *(uint *)va;
  if ((ulong)uVar1 < 0x29) {
    puVar3 = (undefined8 *)((ulong)uVar1 + *(long *)&va->field_0x10);
    *(uint *)va = uVar1 + 8;
  }
  else {
    puVar3 = *(undefined8 **)&va->field_0x8;
    *(undefined8 **)&va->field_0x8 = puVar3 + 1;
  }
  src = (void *)*puVar3;
  uVar1 = *(uint *)va;
  if ((ulong)uVar1 < 0x29) {
    psVar4 = (size_t *)((ulong)uVar1 + *(long *)&va->field_0x10);
    *(uint *)va = uVar1 + 8;
  }
  else {
    psVar4 = *(size_t **)&va->field_0x8;
    *(size_t **)&va->field_0x8 = psVar4 + 1;
  }
  __n = *psVar4;
  *size = __n;
  if (p != (void *)0x0) {
    if (src == (void *)0x0) {
      memset(p,0,__n);
    }
    else {
      __wrap_memcpy(p,src,__n);
    }
  }
  __return_storage_ptr__->m_isInitialized = false;
  uVar2 = *(undefined8 *)&va->field_0x8;
  *(undefined8 *)__return_storage_ptr__ = *(undefined8 *)va;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = uVar2;
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = *(undefined8 *)&va->field_0x10;
  __return_storage_ptr__->m_isInitialized = true;
  return __return_storage_ptr__;
}

Assistant:

axl_va_list
	operator () (
		void* p,
		size_t* size,
		axl_va_list va
	) {
		void* obj = va.arg<void*> ();
		size_t objSize = va.arg<size_t> ();

		*size = objSize;

		if (p) {
			if (obj)
				memcpy(p, obj, objSize);
			else
				memset(p, 0, objSize);
		}

		return va;
	}